

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::win_set_option(Nvim *this,Window window,string *name,Object *value)

{
  allocator local_49;
  string local_48;
  Object *local_28;
  Object *value_local;
  string *name_local;
  Window window_local;
  Nvim *this_local;
  
  local_28 = value;
  value_local = (Object *)name;
  name_local = (string *)window;
  window_local = (Window)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_win_set_option",&local_49);
  NvimRPC::
  call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_48,(nullptr_t)0x0,(long *)&name_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
             local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Nvim::win_set_option(Window window, const std::string& name, const Object& value) {
    client_.call("nvim_win_set_option", nullptr, window, name, value);
}